

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall glslang::HlslParseContext::fixBuiltInIoType(HlslParseContext *this,TType *type)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  reference pvVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TQualifier *__dest;
  TArraySizes *this_00;
  TType *copyOf;
  TArraySizes *arraySizes;
  TType newType;
  int local_20;
  int loc;
  int requiredVectorSize;
  int requiredArraySize;
  TType *type_local;
  HlslParseContext *this_local;
  
  loc = 0;
  local_20 = 0;
  copyOf = type;
  iVar2 = (*type->_vptr_TType[10])();
  switch(*(uint *)(CONCAT44(extraout_var,iVar2) + 8) >> 7 & 0x1ff) {
  case 3:
    local_20 = 3;
    break;
  case 4:
    local_20 = 3;
    break;
  case 5:
    local_20 = 3;
    break;
  default:
    bVar1 = isClipOrCullDistance(type);
    if (!bVar1) {
      return;
    }
    iVar2 = (*type->_vptr_TType[10])();
    newType.spirvType._4_4_ = (uint)*(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 0x1c) & 0xfff;
    iVar2 = (*type->_vptr_TType[10])();
    if (((uint)(*(ulong *)(CONCAT44(extraout_var_01,iVar2) + 8) >> 7) & 0x1ff) == 0x21) {
      iVar2 = (*type->_vptr_TType[10])();
      if (((uint)*(undefined8 *)(CONCAT44(extraout_var_02,iVar2) + 8) & 0x7f) == 3) {
        iVar2 = (*type->_vptr_TType[0xc])();
        pvVar4 = std::array<int,_2UL>::operator[]
                           (&this->clipSemanticNSizeIn,(long)(int)newType.spirvType._4_4_);
        *pvVar4 = iVar2;
        return;
      }
      iVar2 = (*type->_vptr_TType[0xc])();
      pvVar4 = std::array<int,_2UL>::operator[]
                         (&this->clipSemanticNSizeOut,(long)(int)newType.spirvType._4_4_);
      *pvVar4 = iVar2;
      return;
    }
    iVar2 = (*type->_vptr_TType[10])();
    if (((uint)*(undefined8 *)(CONCAT44(extraout_var_03,iVar2) + 8) & 0x7f) == 3) {
      iVar2 = (*type->_vptr_TType[0xc])();
      pvVar4 = std::array<int,_2UL>::operator[]
                         (&this->cullSemanticNSizeIn,(long)(int)newType.spirvType._4_4_);
      *pvVar4 = iVar2;
      return;
    }
    iVar2 = (*type->_vptr_TType[0xc])();
    pvVar4 = std::array<int,_2UL>::operator[]
                       (&this->cullSemanticNSizeOut,(long)(int)newType.spirvType._4_4_);
    *pvVar4 = iVar2;
    return;
  case 0x38:
    loc = 4;
    break;
  case 0x39:
    loc = 2;
    break;
  case 0x3b:
    local_20 = 3;
    break;
  case 0x47:
    uVar3 = (*type->_vptr_TType[0x1d])();
    loc = (int)((uVar3 & 1) == 0);
  }
  if (local_20 != 0) {
    t = (*type->_vptr_TType[7])();
    iVar2 = (*type->_vptr_TType[10])();
    TType::TType((TType *)&arraySizes,t,
                 (TStorageQualifier)*(undefined8 *)(CONCAT44(extraout_var_04,iVar2) + 8) & 0x7f,
                 local_20,0,0,false);
    iVar2 = (*type->_vptr_TType[10])();
    __dest = TType::getQualifier((TType *)&arraySizes);
    memcpy(__dest,(void *)CONCAT44(extraout_var_05,iVar2),0x50);
    copyOf = (TType *)&arraySizes;
    TType::shallowCopy(type,copyOf);
    TType::~TType((TType *)&arraySizes);
  }
  if ((loc != 0) &&
     ((uVar3 = (*type->_vptr_TType[0x1d])(), (uVar3 & 1) == 0 ||
      (iVar2 = (*type->_vptr_TType[0xf])(), iVar2 != loc)))) {
    this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)copyOf);
    TArraySizes::TArraySizes(this_00);
    TArraySizes::addInnerSize(this_00,loc);
    TType::transferArraySizes(type,this_00);
  }
  return;
}

Assistant:

void HlslParseContext::fixBuiltInIoType(TType& type)
{
    int requiredArraySize = 0;
    int requiredVectorSize = 0;

    switch (type.getQualifier().builtIn) {
    case EbvTessLevelOuter: requiredArraySize = 4; break;
    case EbvTessLevelInner: requiredArraySize = 2; break;

    case EbvSampleMask:
        {
            // Promote scalar to array of size 1.  Leave existing arrays alone.
            if (!type.isArray())
                requiredArraySize = 1;
            break;
        }

    case EbvWorkGroupId:        requiredVectorSize = 3; break;
    case EbvGlobalInvocationId: requiredVectorSize = 3; break;
    case EbvLocalInvocationId:  requiredVectorSize = 3; break;
    case EbvTessCoord:          requiredVectorSize = 3; break;

    default:
        if (isClipOrCullDistance(type)) {
            const int loc = type.getQualifier().layoutLocation;

            if (type.getQualifier().builtIn == EbvClipDistance) {
                if (type.getQualifier().storage == EvqVaryingIn)
                    clipSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    clipSemanticNSizeOut[loc] = type.getVectorSize();
            } else {
                if (type.getQualifier().storage == EvqVaryingIn)
                    cullSemanticNSizeIn[loc] = type.getVectorSize();
                else
                    cullSemanticNSizeOut[loc] = type.getVectorSize();
            }
        }

        return;
    }

    // Alter or set vector size as needed.
    if (requiredVectorSize > 0) {
        TType newType(type.getBasicType(), type.getQualifier().storage, requiredVectorSize);
        newType.getQualifier() = type.getQualifier();

        type.shallowCopy(newType);
    }

    // Alter or set array size as needed.
    if (requiredArraySize > 0) {
        if (!type.isArray() || type.getOuterArraySize() != requiredArraySize) {
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(requiredArraySize);
            type.transferArraySizes(arraySizes);
        }
    }
}